

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

SequenceSymbol *
slang::ast::SequenceSymbol::fromSyntax(Scope *scope,SequenceDeclarationSyntax *syntax)

{
  Compilation *args;
  int iVar1;
  SequenceSymbol *pSVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_01;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  SourceLocation local_68;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> local_60 [2];
  
  args = scope->compilation;
  local_60[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_68 = parsing::Token::location(&syntax->name);
  pSVar2 = BumpAllocator::
           emplace<slang::ast::SequenceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&args->super_BumpAllocator,args,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_60,&local_68);
  (pSVar2->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  local_60[0].len = 0;
  local_60[0].data_ = (pointer)((long)local_60 + 0x18U);
  local_60[0].cap = 5;
  src = extraout_RDX;
  if (syntax->portList != (AssertionItemPortListSyntax *)0x0) {
    AssertionPortSymbol::buildPorts(&pSVar2->super_Scope,syntax->portList,local_60);
    src = extraout_RDX_00;
  }
  iVar1 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    (local_60,(EVP_PKEY_CTX *)args,src);
  (pSVar2->ports).data_ = (pointer)CONCAT44(extraout_var,iVar1);
  (pSVar2->ports).size_ = extraout_RDX_01;
  if (local_60[0].data_ != (pointer)((long)local_60 + 0x18U)) {
    free(local_60[0].data_);
  }
  return pSVar2;
}

Assistant:

SequenceSymbol& SequenceSymbol::fromSyntax(const Scope& scope,
                                           const SequenceDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SequenceSymbol>(comp, syntax.name.valueText(),
                                               syntax.name.location());
    result->setSyntax(syntax);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList)
        AssertionPortSymbol::buildPorts(*result, *syntax.portList, ports);
    result->ports = ports.copy(comp);

    return *result;
}